

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

void __thiscall CoreML::ShapeRange::ShapeRange(ShapeRange *this,RangeValue *min,RangeValue *max)

{
  undefined7 uVar1;
  bool bVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  string local_388 [32];
  stringstream local_368 [8];
  stringstream ss_1;
  ostream local_358 [383];
  undefined1 local_1d9;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  RangeValue *local_20;
  RangeValue *max_local;
  RangeValue *min_local;
  ShapeRange *this_local;
  
  uVar1 = *(undefined7 *)&min->field_0x1;
  (this->_minimum)._isUnbound = min->_isUnbound;
  *(undefined7 *)&(this->_minimum).field_0x1 = uVar1;
  (this->_minimum)._val = min->_val;
  uVar1 = *(undefined7 *)&max->field_0x1;
  (this->_maximum)._isUnbound = max->_isUnbound;
  *(undefined7 *)&(this->_maximum).field_0x1 = uVar1;
  (this->_maximum)._val = max->_val;
  local_20 = max;
  max_local = min;
  min_local = &this->_minimum;
  bVar2 = RangeValue::operator>(min,max);
  if (bVar2) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar3 = std::operator<<(local_198,"Constructing invalid ShapeRange with ");
    poVar3 = ::operator<<(poVar3,max_local);
    poVar3 = std::operator<<(poVar3,", ");
    ::operator<<(poVar3,local_20);
    local_1d9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1d8);
    local_1d9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = RangeValue::isUnbound(max_local);
  if (!bVar2) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_368);
  std::operator<<(local_358,"Constructing invalid ShapeRange unbound minimum value.");
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(prVar4,local_388);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ShapeRange::ShapeRange(const RangeValue& min, const RangeValue& max)
:
_minimum(min),
_maximum(max)
{
    if (min > max)
    {
        std::stringstream ss;
        ss << "Constructing invalid ShapeRange with " << min << ", " << max;
        throw std::runtime_error(ss.str());
    }
    if (min.isUnbound()) {
        std::stringstream ss;
        ss << "Constructing invalid ShapeRange unbound minimum value.";
        throw std::runtime_error(ss.str());
    }
}